

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall TPZMHMeshControl::InsertPeriferalMaterialObjects(TPZMHMeshControl *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  code *pcVar4;
  TPZMaterial *pTVar5;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *pTVar6;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_> *this_00;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_> *this_01;
  undefined8 uVar7;
  TPZFNMatrix<4,_double> val2Flux;
  TPZFNMatrix<4,_double> val1;
  double local_1a8;
  TPZFNMatrix<4,_double> local_1a0;
  TPZFNMatrix<4,_double> local_e8;
  
  pTVar5 = TPZCompMesh::FindMaterial
                     (((this->fCMesh).fRef)->fPointer,
                      (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                      _M_color);
  if (pTVar5 == (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x64a);
  }
  local_1a0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<4,_double>::TPZFNMatrix
            (&local_e8,(long)this->fNState,(long)this->fNState,(double *)&local_1a0);
  local_1a8 = 0.0;
  TPZFNMatrix<4,_double>::TPZFNMatrix(&local_1a0,(long)this->fNState,1,&local_1a8);
  pTVar5 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fSkeletonMatId);
  if (pTVar5 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x651);
  }
  pTVar6 = (TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *)operator_new(0x50);
  iVar1 = this->fSkeletonMatId;
  *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZSavable_018eff30;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>_>::TPZMatBase(pTVar6,&PTR_PTR_018ef458,iVar1);
  *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZNullMaterial_018ef278;
  (pTVar6->super_TPZMatSingleSpaceT<double>).super_TPZMatSingleSpace =
       (TPZMatSingleSpace)&PTR__TPZNullMaterial_018ef3c0;
  *(undefined8 *)&pTVar6[1].super_TPZMaterialT<double>.super_TPZMaterial = 0x100000001;
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)pTVar6);
  pTVar5 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fPressureSkeletonMatId);
  if (pTVar5 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x658);
  }
  pTVar6 = (TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *)operator_new(0x50);
  iVar1 = this->fPressureSkeletonMatId;
  *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZSavable_018eff30;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>_>::TPZMatBase(pTVar6,&PTR_PTR_018ef458,iVar1);
  *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZNullMaterial_018ef278;
  (pTVar6->super_TPZMatSingleSpaceT<double>).super_TPZMatSingleSpace =
       (TPZMatSingleSpace)&PTR__TPZNullMaterial_018ef3c0;
  *(undefined8 *)&pTVar6[1].super_TPZMaterialT<double>.super_TPZMaterial = 0x100000001;
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)pTVar6);
  pTVar5 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fSecondSkeletonMatId);
  if (pTVar5 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x65e);
  }
  pTVar6 = (TPZMatBase<double,_TPZMatSingleSpaceT<double>_> *)operator_new(0x50);
  iVar1 = this->fSecondSkeletonMatId;
  *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZSavable_018eff30;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>_>::TPZMatBase(pTVar6,&PTR_PTR_018ef458,iVar1);
  *(undefined ***)&(pTVar6->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZNullMaterial_018ef278;
  (pTVar6->super_TPZMatSingleSpaceT<double>).super_TPZMatSingleSpace =
       (TPZMatSingleSpace)&PTR__TPZNullMaterial_018ef3c0;
  *(undefined8 *)&pTVar6[1].super_TPZMaterialT<double>.super_TPZMaterial = 0x100000001;
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)pTVar6);
  iVar1 = this->fNState;
  iVar2 = ((this->fGMesh).fRef)->fPointer->fDim;
  pTVar5 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fLagrangeMatIdLeft);
  if (pTVar5 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x66b);
  }
  pTVar5 = TPZCompMesh::FindMaterial(((this->fCMesh).fRef)->fPointer,this->fLagrangeMatIdRight);
  if (pTVar5 != (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x66e);
  }
  this_00 = (TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_> *)
            operator_new(0x68);
  iVar3 = this->fLagrangeMatIdLeft;
  *(undefined ***)&(this_00->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZSavable_018f65c8;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>::TPZMatBase
            (this_00,&PTR_PTR_018f5780,iVar3);
  *(undefined ***)&(this_00->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZLagrangeMultiplier_018f5488;
  (this_00->super_TPZMatSingleSpaceT<double>).super_TPZMatSingleSpace =
       (TPZMatSingleSpace)&PTR__TPZLagrangeMultiplier_018f55f8;
  this_00->super_TPZMatInterfaceSingleSpace<double> =
       (TPZMatInterfaceSingleSpace<double>)&PTR__TPZLagrangeMultiplier_018f56e8;
  *(undefined **)&this_00[1].super_TPZMaterialT<double>.super_TPZMaterial = &DAT_018f5770;
  *(int *)&this_00[1].super_TPZMaterialT<double>.super_TPZMaterial.fBigNumber = iVar1;
  *(int *)((long)&this_00[1].super_TPZMaterialT<double>.super_TPZMaterial.fBigNumber + 4) = iVar2;
  *(undefined8 *)&this_00[1].super_TPZMaterialT<double>.super_TPZMaterial.fId = 0x3ff0000000000000;
  this_01 = (TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_> *)
            operator_new(0x68);
  iVar3 = this->fLagrangeMatIdRight;
  *(undefined ***)&(this_01->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZSavable_018f65c8;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>::TPZMatBase
            (this_01,&PTR_PTR_018f5780,iVar3);
  *(undefined ***)&(this_01->super_TPZMaterialT<double>).super_TPZMaterial =
       &PTR__TPZLagrangeMultiplier_018f5488;
  (this_01->super_TPZMatSingleSpaceT<double>).super_TPZMatSingleSpace =
       (TPZMatSingleSpace)&PTR__TPZLagrangeMultiplier_018f55f8;
  this_01->super_TPZMatInterfaceSingleSpace<double> =
       (TPZMatInterfaceSingleSpace<double>)&PTR__TPZLagrangeMultiplier_018f56e8;
  *(undefined **)&this_01[1].super_TPZMaterialT<double>.super_TPZMaterial = &DAT_018f5770;
  *(int *)&this_01[1].super_TPZMaterialT<double>.super_TPZMaterial.fBigNumber = iVar1;
  *(int *)((long)&this_01[1].super_TPZMaterialT<double>.super_TPZMaterial.fBigNumber + 4) = iVar2;
  *(undefined8 *)&this_01[1].super_TPZMaterialT<double>.super_TPZMaterial.fId = 0x3ff0000000000000;
  pcVar4 = *(code **)(*(long *)&(this_00->super_TPZMaterialT<double>).super_TPZMaterial + 200);
  if (this->fSwitchLagrangeSign == true) {
    (*pcVar4)(0xbff0000000000000,this_00);
    uVar7 = 0x3ff0000000000000;
  }
  else {
    (*pcVar4)(0x3ff0000000000000,this_00);
    uVar7 = 0xbff0000000000000;
  }
  (**(code **)(*(long *)&(this_01->super_TPZMaterialT<double>).super_TPZMaterial + 200))
            (uVar7,this_01);
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)this_00);
  TPZCompMesh::InsertMaterialObject(((this->fCMesh).fRef)->fPointer,(TPZMaterial *)this_01);
  TPZFMatrix<double>::~TPZFMatrix(&local_1a0.super_TPZFMatrix<double>,&PTR_PTR_018a08b8);
  TPZFMatrix<double>::~TPZFMatrix(&local_e8.super_TPZFMatrix<double>,&PTR_PTR_018a08b8);
  return;
}

Assistant:

void TPZMHMeshControl::InsertPeriferalMaterialObjects()
{
    int matid = *fMaterialIds.begin();
    TPZMaterial *mat = fCMesh->FindMaterial(matid);
    if (!mat) {
        DebugStop();
    }

    TPZFNMatrix<4,STATE> val1(fNState,fNState,0.), val2Flux(fNState,1,0.);
    TPZMaterial *matPerif = nullptr;

    if (fCMesh->FindMaterial(fSkeletonMatId)) {
        DebugStop();
    }
    matPerif = new TPZNullMaterial<STATE>(fSkeletonMatId);
    fCMesh->InsertMaterialObject(matPerif);

    if (1) {
        if (fCMesh->FindMaterial(fPressureSkeletonMatId)) {
            DebugStop();
        }
        matPerif = new TPZNullMaterial<STATE>(fPressureSkeletonMatId);
        fCMesh->InsertMaterialObject(matPerif);

        if (fCMesh->FindMaterial(fSecondSkeletonMatId)) {
            DebugStop();
        }
        matPerif = new TPZNullMaterial<STATE>(fSecondSkeletonMatId);

        fCMesh->InsertMaterialObject(matPerif);


        int LagrangeMatIdLeft = 50;
        int LagrangeMatIdRight = 51;
        int nstate = fNState;
        int dim = fGMesh->Dimension();

        if (fCMesh->FindMaterial(fLagrangeMatIdLeft)) {
            DebugStop();
        }
        if (fCMesh->FindMaterial(fLagrangeMatIdRight)) {
            DebugStop();
        }
        auto *matleft = new TPZLagrangeMultiplier<STATE>(fLagrangeMatIdLeft,dim,nstate);
        auto *matright = new TPZLagrangeMultiplier<STATE>(fLagrangeMatIdRight,dim,nstate);
        if (fSwitchLagrangeSign) {
            matleft->SetMultiplier(-1.);
            matright->SetMultiplier(1.);
        }
        else
        {
            matleft->SetMultiplier(1.);
            matright->SetMultiplier(-1.);
        }
        fCMesh->InsertMaterialObject(matleft);
        fCMesh->InsertMaterialObject(matright);
    }

}